

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::updateIsTranslucent(QWidgetPrivate *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  QSurfaceFormat *pQVar4;
  long in_FS_OFFSET;
  QSurfaceFormat format;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(*(long *)(lVar3 + 8) + 0x78);
  if (lVar2 == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(lVar2 + 8);
  }
  if (lVar2 == 0) {
    pQVar4 = (QSurfaceFormat *)0x0;
  }
  else {
    pQVar4 = *(QSurfaceFormat **)(lVar2 + 0x20);
  }
  if (pQVar4 != (QSurfaceFormat *)0x0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)pQVar4 + 0x68))(&local_30,pQVar4);
    uVar1 = QSurfaceFormat::alphaBufferSize();
    if (uVar1 != (-(uint)((*(byte *)(*(long *)(lVar3 + 8) + 0x24b) & 1) == 0) | 8)) {
      lVar3 = QWindow::handle();
      if (lVar3 == 0) {
        QSurfaceFormat::setAlphaBufferSize((int)&local_30);
        QWindow::setFormat(pQVar4);
      }
    }
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::updateIsTranslucent()
{
    Q_Q(QWidget);
    if (QWindow *window = q->windowHandle()) {
        QSurfaceFormat format = window->format();
        const int oldAlpha = format.alphaBufferSize();
        const int newAlpha = q->testAttribute(Qt::WA_TranslucentBackground) ? 8 : -1;
        if (oldAlpha != newAlpha) {
            // QTBUG-85714: Do this only when the QWindow has not yet been create()'ed yet.
            //
            // If that is not the case, then the setFormat() is not just futile
            // but downright dangerous. Futile because the format matters only
            // when creating the native window, no point in changing it
            // afterwards. Dangerous because a QOpenGLContext or something else
            // may eventually query the QWindow's format(), in order to ensure
            // compatibility (in terms of native concepts such as pixel format,
            // EGLConfig, etc.), and if we change it here, then the returned
            // format does not describe reality anymore. (reality being the
            // settings with which the native resource was created).
            //
            // Whereas if one does a destroy()-create() then this all here
            // won't matter because the format is updated in
            // QWidgetPrivate::create() again.
            //
            if (!window->handle()) {
                format.setAlphaBufferSize(newAlpha);
                window->setFormat(format);
            }
        }
    }
}